

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O3

void save_tx(storage_t *st,void *key,size_t keylen,tx_type_t type)

{
  int iVar1;
  fdb_status fVar2;
  void *value;
  char *key_00;
  fdb_kvs_handle *handle;
  int i;
  long lVar3;
  char txkey [12];
  timeval __test_begin;
  char local_4c [12];
  timeval local_40;
  
  lVar3 = 0;
  gettimeofday((timeval *)(local_4c + 0xc),(__timezone_ptr_t)0x0);
  do {
    iVar1 = rand();
    local_4c[lVar3] =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[(ulong)(long)iVar1 % 0x3e]
    ;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xc);
  key_00 = local_4c;
  local_4c[0xb] = 0;
  value = calloc(1,0x418);
  *(tx_type_t *)((long)value + 0x410) = type;
  *(size_t *)((long)value + 0x408) = keylen;
  memcpy((void *)((long)value + 4),key,keylen);
  handle = st->rtx;
  fVar2 = fdb_set_kv(handle,key_00,0xc,value,0x418);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    save_tx_cold_1();
    iVar1 = strcmp(key_00 + 0x400,(char *)handle);
    if (-1 < iVar1) {
      strcmp(key_00 + 0x400,(char *)((long)&(handle->kvs_config).custom_cmp + 4));
    }
    return;
  }
  free(value);
  return;
}

Assistant:

void save_tx(storage_t *st, void *key, size_t keylen, tx_type_t type){

    TEST_INIT();
    char txkey[12];
    transaction_t *tx = NULL;
    fdb_status status;

    gen_random(txkey, 12);
    tx = (transaction_t*)malloc(sizeof(transaction_t));
    memset(tx, 0, sizeof(transaction_t));
    tx->type = type;
    tx->refkey_len = keylen;
    memcpy(tx->refkey, key, keylen);

    status = fdb_set_kv(st->rtx, txkey, 12,
                        tx, sizeof(transaction_t));
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    free(tx);
    tx=NULL;

}